

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  short sVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 IVar7;
  int iVar8;
  char *pcVar9;
  uint in_ECX;
  byte *in_RDX;
  char *in_RSI;
  ImGuiTabBar *in_RDI;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  float fVar13;
  ImVec2 IVar14;
  ImVec2 IVar15;
  bool text_clipped;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  bool pressed;
  bool held;
  bool hovered;
  ImGuiButtonFlags button_flags;
  ImVec2 backup_cursor_max_pos;
  bool want_clip_rect;
  ImRect bb;
  ImVec2 pos;
  bool is_central_section;
  ImVec2 backup_main_cursor_pos;
  bool tab_contents_visible;
  bool is_tab_button;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  bool tab_is_new;
  ImGuiTabItem *tab;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  ImGuiMouseButton button;
  ImGuiTabItem *in_stack_fffffffffffffe40;
  ImGuiTabBar *in_stack_fffffffffffffe48;
  undefined1 repeat;
  float in_stack_fffffffffffffe50;
  ImGuiID in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 intersect_with_current_clip_rect;
  ImRect *in_stack_fffffffffffffe68;
  ImGuiTabItem *in_stack_fffffffffffffe70;
  ImGuiTabBar *in_stack_fffffffffffffe78;
  ImVec2 in_stack_fffffffffffffe80;
  ImGuiID id_00;
  ImRect *bb_00;
  byte local_14e;
  byte local_14d;
  byte local_126;
  byte local_125;
  ImDrawList *in_stack_fffffffffffffef0;
  byte bVar16;
  ImVec2 local_f8;
  ImRect local_f0;
  undefined1 is_contents_visible;
  ImGuiID in_stack_ffffffffffffff28;
  ImGuiID in_stack_ffffffffffffff2c;
  ImVec2 in_stack_ffffffffffffff30;
  undefined1 local_c8 [4];
  float in_stack_ffffffffffffff3c;
  ImVec2 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint uVar17;
  float fVar18;
  float fVar19;
  float in_stack_ffffffffffffff54;
  byte bVar20;
  byte bVar21;
  undefined4 in_stack_ffffffffffffff6c;
  bool *in_stack_ffffffffffffff70;
  ImGuiTabItem *local_68;
  float local_5c;
  uint local_24;
  byte *local_20;
  bool local_1;
  
  if ((in_RDI->WantLayout & 1U) != 0) {
    TabBarLayout(in_RDI);
  }
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((pIVar3->SkipItems & 1U) == 0) {
    IVar7 = TabBarCalcTabID(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
    repeat = (undefined1)((ulong)in_stack_fffffffffffffe48 >> 0x38);
    if ((in_RDX == (byte *)0x0) || ((*in_RDX & 1) != 0)) {
      local_24 = in_ECX;
      if ((in_ECX & 0x100000) == 0) {
        local_20 = in_RDX;
        if (in_RDX == (byte *)0x0) {
          local_24 = in_ECX | 0x100000;
        }
      }
      else {
        local_20 = (byte *)0x0;
      }
      IVar14 = TabItemCalcSize((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                               ,SUB41(in_stack_fffffffffffffe54 >> 0x18,0));
      local_68 = TabBarFindTabByID((ImGuiTabBar *)
                                   CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),0);
      bVar10 = local_68 == (ImGuiTabItem *)0x0;
      local_5c = IVar14.x;
      if (bVar10) {
        ImGuiTabItem::ImGuiTabItem(in_stack_fffffffffffffe40);
        ImVector<ImGuiTabItem>::push_back
                  ((ImVector<ImGuiTabItem> *)in_stack_fffffffffffffe40,
                   (ImGuiTabItem *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_68 = ImVector<ImGuiTabItem>::back(&in_RDI->Tabs);
        local_68->ID = IVar7;
        local_68->Width = local_5c;
        in_RDI->TabsAddedNew = true;
      }
      iVar8 = ImVector<ImGuiTabItem>::index_from_ptr(&in_RDI->Tabs,local_68);
      in_RDI->LastTabItemIdx = (ImS16)iVar8;
      local_68->ContentWidth = local_5c;
      sVar2 = in_RDI->TabsActiveCount;
      in_RDI->TabsActiveCount = sVar2 + 1;
      local_68->BeginOrder = sVar2;
      bVar21 = in_RDI->PrevFrameVisible + 1 < pIVar5->FrameCount;
      bVar11 = (in_RDI->Flags & 0x200000U) != 0;
      bVar20 = local_68->LastFrameVisible + 1 < pIVar5->FrameCount;
      bVar12 = (local_24 & 0x200000) != 0;
      local_68->LastFrameVisible = pIVar5->FrameCount;
      local_68->Flags = local_24;
      iVar8 = ImGuiTextBuffer::size(&in_RDI->TabsNames);
      local_68->NameOffset = iVar8;
      bb_00 = (ImRect *)&in_RDI->TabsNames;
      pcVar9 = in_RSI;
      strlen(in_RSI);
      id_00 = (ImGuiID)((ulong)pcVar9 >> 0x20);
      ImGuiTextBuffer::append
                ((ImGuiTextBuffer *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                 (char *)CONCAT17(in_stack_fffffffffffffe67,
                                  CONCAT16(in_stack_fffffffffffffe66,
                                           CONCAT24(in_stack_fffffffffffffe64,
                                                    in_stack_fffffffffffffe60))));
      if (((((bVar20 & 1) != 0) && ((in_RDI->Flags & 2U) != 0)) && (in_RDI->NextSelectedTabId == 0))
         && ((((bVar21 & 1) == 0 || (in_RDI->SelectedTabId == 0)) && ((bVar12 & 1) == 0)))) {
        in_RDI->NextSelectedTabId = IVar7;
      }
      if ((((local_24 & 2) != 0) && (in_RDI->SelectedTabId != IVar7)) && ((bVar12 & 1) == 0)) {
        in_RDI->NextSelectedTabId = IVar7;
      }
      local_1 = in_RDI->VisibleTabId == IVar7;
      if (local_1) {
        in_RDI->VisibleTabWasSubmitted = true;
      }
      else if ((((in_RDI->SelectedTabId == 0) && ((bVar21 & 1) != 0)) && ((in_RDI->Tabs).Size == 1))
              && ((in_RDI->Flags & 2U) == 0)) {
        local_1 = true;
      }
      if (((bVar20 & 1) == 0) || (((bVar21 & 1) != 0 && (!bVar10)))) {
        if (in_RDI->SelectedTabId == IVar7) {
          local_68->LastFrameSelected = pIVar5->FrameCount;
        }
        IVar14 = (pIVar3->DC).CursorPos;
        fVar18 = IVar14.x;
        fVar19 = IVar14.y;
        bVar10 = (local_68->Flags & 0xc0U) == 0;
        uVar17 = CONCAT13(bVar10,(int3)in_stack_ffffffffffffff48);
        if (bVar10) {
          in_stack_fffffffffffffe78 = (ImGuiTabBar *)&in_RDI->BarRect;
          in_stack_fffffffffffffe80 = (ImVec2)local_c8;
          ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffe80,
                         (float)(int)(local_68->Offset - in_RDI->ScrollingAnim),0.0);
          button = (ImGuiMouseButton)in_stack_fffffffffffffe40;
          in_stack_ffffffffffffff40 =
               operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         (ImVec2 *)0x1b8ae2);
          (pIVar3->DC).CursorPos = in_stack_ffffffffffffff40;
        }
        else {
          in_stack_fffffffffffffe68 = &in_RDI->BarRect;
          in_stack_fffffffffffffe70 = (ImGuiTabItem *)&stack0xffffffffffffff28;
          ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffe70,local_68->Offset,0.0);
          button = (ImGuiMouseButton)in_stack_fffffffffffffe40;
          in_stack_ffffffffffffff30 =
               operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         (ImVec2 *)0x1b8b46);
          (pIVar3->DC).CursorPos = in_stack_ffffffffffffff30;
        }
        is_contents_visible = SUB81((pIVar3->DC).CursorPos,7);
        local_f8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                             ,(ImVec2 *)0x1b8b92);
        ImRect::ImRect(&local_f0,(ImVec2 *)&stack0xffffffffffffff20,&local_f8);
        intersect_with_current_clip_rect = false;
        if (((uVar17 & 0x1000000) != 0) &&
           (in_stack_fffffffffffffe66 = true,
           intersect_with_current_clip_rect = in_stack_fffffffffffffe66,
           in_RDI->ScrollingRectMinX <= local_f0.Min.x)) {
          in_stack_fffffffffffffe66 =
               in_RDI->ScrollingRectMaxX <= local_f0.Max.x &&
               local_f0.Max.x != in_RDI->ScrollingRectMaxX;
          intersect_with_current_clip_rect = in_stack_fffffffffffffe66;
        }
        bVar16 = intersect_with_current_clip_rect;
        if ((bool)intersect_with_current_clip_rect != false) {
          fVar13 = ImMax<float>(local_f0.Min.x,in_RDI->ScrollingRectMinX);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffefc,fVar13,local_f0.Min.y - 1.0);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef4,in_RDI->ScrollingRectMaxX,local_f0.Max.y
                        );
          PushClipRect((ImVec2 *)in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->Min,
                       (bool)intersect_with_current_clip_rect);
        }
        IVar14 = (pIVar3->DC).CursorMaxPos;
        IVar15 = ImRect::GetSize((ImRect *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        ItemSize((ImVec2 *)
                 CONCAT17(intersect_with_current_clip_rect,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60))),
                 in_stack_fffffffffffffe5c);
        (pIVar3->DC).CursorMaxPos = IVar14;
        bVar10 = ItemAdd(in_stack_fffffffffffffe68,
                         CONCAT13(intersect_with_current_clip_rect,
                                  CONCAT12(in_stack_fffffffffffffe66,in_stack_fffffffffffffe64)),
                         (ImRect *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                         in_stack_fffffffffffffe54);
        if (bVar10) {
          bVar10 = ButtonBehavior(bb_00,id_00,(bool *)in_stack_fffffffffffffe80,
                                  (bool *)in_stack_fffffffffffffe78,
                                  (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          if ((bVar10) && ((bVar12 & 1) == 0)) {
            in_RDI->NextSelectedTabId = IVar7;
          }
          if (pIVar5->ActiveId != IVar7) {
            SetItemAllowOverlap();
          }
          if (((((local_126 & 1) != 0) && ((bVar20 & 1) == 0)) &&
              (bVar6 = IsMouseDragging(button,in_stack_fffffffffffffe3c), bVar6)) &&
             (((pIVar5->DragDropActive & 1U) == 0 && ((in_RDI->Flags & 1U) != 0)))) {
            pIVar1 = &(pIVar5->IO).MouseDelta;
            if ((0.0 < pIVar1->x || pIVar1->x == 0.0) || (local_f0.Min.x <= (pIVar5->IO).MousePos.x)
               ) {
              if ((0.0 < (pIVar5->IO).MouseDelta.x) && (local_f0.Max.x < (pIVar5->IO).MousePos.x)) {
                TabBarQueueReorderFromMousePos
                          (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                           in_stack_fffffffffffffe80);
              }
            }
            else {
              TabBarQueueReorderFromMousePos
                        (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                         in_stack_fffffffffffffe80);
            }
          }
          if (((local_126 & 1) == 0) && ((local_125 & 1) == 0)) {
            if (local_1 == false) {
              in_stack_fffffffffffffe5c = 5.04467e-44;
              fVar13 = in_stack_fffffffffffffe5c;
              if ((bVar11 & 1) != 0) {
                in_stack_fffffffffffffe5c = 4.62428e-44;
                fVar13 = in_stack_fffffffffffffe5c;
              }
            }
            else {
              in_stack_fffffffffffffe5c = 5.1848e-44;
              fVar13 = in_stack_fffffffffffffe5c;
              if ((bVar11 & 1) != 0) {
                in_stack_fffffffffffffe5c = 4.90454e-44;
                fVar13 = in_stack_fffffffffffffe5c;
              }
            }
          }
          else {
            fVar13 = 4.76441e-44;
          }
          GetColorU32(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
          TabItemBackground(in_stack_fffffffffffffef0,(ImRect *)IVar14,(ImGuiTabItemFlags)IVar15.y,
                            (ImU32)IVar15.x);
          RenderNavHighlight((ImRect *)in_stack_fffffffffffffef0,(ImGuiID)IVar14.y,
                             (ImGuiNavHighlightFlags)IVar14.x);
          bVar6 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe50);
          if ((bVar6) &&
             (((bVar6 = IsMouseClicked((ImGuiMouseButton)in_stack_fffffffffffffe50,(bool)repeat),
               bVar6 || (bVar6 = IsMouseReleased(1), bVar6)) && ((bVar12 & 1) == 0)))) {
            in_RDI->NextSelectedTabId = IVar7;
          }
          if (local_20 != (byte *)0x0) {
            GetIDWithSeed((char *)CONCAT17(intersect_with_current_clip_rect,
                                           CONCAT16(in_stack_fffffffffffffe66,
                                                    CONCAT24(in_stack_fffffffffffffe64,fVar13))),
                          (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                          in_stack_fffffffffffffe54);
          }
          IVar15.y = in_stack_ffffffffffffff54;
          IVar15.x = fVar19;
          TabItemLabelAndCloseButton
                    ((ImDrawList *)CONCAT44(fVar18,uVar17),(ImRect *)in_stack_ffffffffffffff40,
                     (ImGuiTabItemFlags)in_stack_ffffffffffffff3c,IVar15,
                     (char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     in_stack_ffffffffffffff28,(bool)is_contents_visible,
                     (bool *)CONCAT44(in_stack_ffffffffffffff6c,
                                      CONCAT13(bVar21,CONCAT12(bVar11,CONCAT11(bVar20,bVar12)))),
                     in_stack_ffffffffffffff70);
          if (((local_14d & 1) != 0) && (local_20 != (byte *)0x0)) {
            *local_20 = 0;
            TabBarCloseTab(in_RDI,local_68);
          }
          if ((bVar16 & 1) != 0) {
            PopClipRect();
          }
          IVar4.y = fVar19;
          IVar4.x = fVar18;
          (pIVar3->DC).CursorPos = IVar4;
          if (((((local_14e & 1) != 0) && (pIVar5->HoveredId == IVar7)) &&
              (((local_126 & 1) == 0 &&
               (((pIVar5->TooltipSlowDelay <= pIVar5->HoveredIdNotActiveTimer &&
                  pIVar5->HoveredIdNotActiveTimer != pIVar5->TooltipSlowDelay &&
                 (bVar6 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe50), bVar6)) &&
                ((in_RDI->Flags & 0x20U) == 0)))))) && ((local_68->Flags & 0x10U) == 0)) {
            pcVar9 = FindRenderedTextEnd(in_RSI,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar9 - (int)in_RSI),in_RSI);
          }
          if ((bVar12 & 1) != 0) {
            local_1 = bVar10;
          }
        }
        else {
          if ((bVar16 & 1) != 0) {
            PopClipRect();
          }
          IVar14.y = fVar19;
          IVar14.x = fVar18;
          (pIVar3->DC).CursorPos = IVar14;
        }
      }
      else {
        ImRect::ImRect((ImRect *)in_stack_fffffffffffffe40);
        ItemAdd(in_stack_fffffffffffffe68,
                CONCAT13(in_stack_fffffffffffffe67,
                         CONCAT12(in_stack_fffffffffffffe66,in_stack_fffffffffffffe64)),
                (ImRect *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                in_stack_fffffffffffffe54);
        if ((bVar12 & 1) != 0) {
          local_1 = false;
        }
      }
    }
    else {
      ImRect::ImRect((ImRect *)in_stack_fffffffffffffe40);
      ItemAdd(in_stack_fffffffffffffe68,
              CONCAT13(in_stack_fffffffffffffe67,
                       CONCAT12(in_stack_fffffffffffffe66,in_stack_fffffffffffffe64)),
              (ImRect *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
              in_stack_fffffffffffffe54);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}